

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O3

void brotli::CreateHuffmanTree(uint32_t *data,size_t length,int tree_limit,uint8_t *depth)

{
  byte bVar1;
  __normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>
  __seed;
  __normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>
  __last;
  pointer pHVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> tree;
  vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_> local_a8;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>,_brotli::HuffmanTree>
  local_88;
  byte *local_70;
  int local_68;
  uint local_64;
  long local_60;
  byte *local_58;
  uint32_t *local_50;
  size_t local_48;
  size_type local_40;
  long local_38;
  
  local_40 = length * 2 + 1;
  local_58 = depth + 1;
  local_60 = length - 1;
  uVar12 = 1;
  local_70 = depth;
  local_68 = tree_limit;
  local_50 = data;
  local_48 = length;
  while( true ) {
    local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
    super__Vector_impl_data._M_start = (HuffmanTree *)0x0;
    local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
    super__Vector_impl_data._M_finish = (HuffmanTree *)0x0;
    local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (HuffmanTree *)0x0;
    std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::reserve
              (&local_a8,local_40);
    __seed._M_current =
         local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    for (; local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_start = __seed._M_current,
        local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_finish = __last._M_current, length != 0;
        length = length - 1) {
      uVar3 = data[length - 1];
      if (uVar3 != 0) {
        if (uVar3 <= uVar12) {
          uVar3 = uVar12;
        }
        local_88._M_original_len = CONCAT26((short)length + -1,CONCAT24(0xffff,uVar3));
        std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>::
        emplace_back<brotli::HuffmanTree>(&local_a8,(HuffmanTree *)&local_88);
      }
      __seed._M_current =
           local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    }
    lVar8 = (long)__last._M_current - (long)__seed._M_current;
    if (lVar8 == 8) {
      local_70[(__seed._M_current)->index_right_or_value_] = 1;
      operator_delete(__seed._M_current,
                      (long)local_a8.
                            super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)__seed._M_current);
      return;
    }
    lVar9 = lVar8 >> 3;
    local_38 = lVar8;
    if (__seed._M_current != __last._M_current) {
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<brotli::HuffmanTree_*,_std::vector<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>_>,_brotli::HuffmanTree>
      ::_Temporary_buffer(&local_88,__seed,(lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
      if (local_88._M_buffer == (HuffmanTree *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<brotli::HuffmanTree*,std::vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>>
                  (__seed,__last,
                   (_Iter_comp_iter<bool_(*)(const_brotli::HuffmanTree_&,_const_brotli::HuffmanTree_&)>
                    )0x179cdf);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<brotli::HuffmanTree*,std::vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>>>,brotli::HuffmanTree*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>>
                  (__seed,__last,local_88._M_buffer,local_88._M_len,
                   (_Iter_comp_iter<bool_(*)(const_brotli::HuffmanTree_&,_const_brotli::HuffmanTree_&)>
                    )0x179cdf);
      }
      operator_delete(local_88._M_buffer,local_88._M_len << 3);
    }
    local_88._M_original_len._0_4_ = 0xffffffff;
    local_88._M_original_len._4_2_ = -1;
    local_88._M_original_len._6_2_ = -1;
    if (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>>::
      _M_realloc_insert<brotli::HuffmanTree_const&>
                ((vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>> *)&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(HuffmanTree *)&local_88);
    }
    else {
      (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
       _M_impl.super__Vector_impl_data._M_finish)->total_count_ = 0xffffffff;
      (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
       _M_impl.super__Vector_impl_data._M_finish)->index_left_ = -1;
      (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
       _M_impl.super__Vector_impl_data._M_finish)->index_right_or_value_ = -1;
      local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>>::
      _M_realloc_insert<brotli::HuffmanTree_const&>
                ((vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>> *)&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(HuffmanTree *)&local_88);
    }
    else {
      (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
       _M_impl.super__Vector_impl_data._M_finish)->total_count_ =
           (undefined4)local_88._M_original_len;
      (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
       _M_impl.super__Vector_impl_data._M_finish)->index_left_ = local_88._M_original_len._4_2_;
      (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
       _M_impl.super__Vector_impl_data._M_finish)->index_right_or_value_ =
           local_88._M_original_len._6_2_;
      local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    lVar8 = lVar9 + -1;
    local_64 = uVar12;
    if (lVar8 != 0) {
      lVar9 = lVar9 + 1;
      lVar11 = 0;
      do {
        uVar3 = local_a8.
                super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar11].total_count_;
        uVar12 = local_a8.
                 super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar9].total_count_;
        lVar5 = lVar11;
        if (uVar12 < uVar3) {
          lVar5 = lVar9;
        }
        lVar11 = lVar11 + (ulong)(uVar3 <= uVar12);
        lVar9 = lVar9 + (ulong)(uVar12 < uVar3);
        uVar3 = local_a8.
                super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar11].total_count_;
        uVar12 = local_a8.
                 super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar9].total_count_;
        lVar6 = lVar11;
        if (uVar12 < uVar3) {
          lVar6 = lVar9;
        }
        local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].total_count_ =
             local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar6].total_count_ +
             local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar5].total_count_;
        local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].index_left_ = (int16_t)lVar5;
        local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].index_right_or_value_ = (int16_t)lVar6;
        if (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>>::
          _M_realloc_insert<brotli::HuffmanTree_const&>
                    ((vector<brotli::HuffmanTree,std::allocator<brotli::HuffmanTree>> *)&local_a8,
                     (iterator)
                     local_a8.
                     super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(HuffmanTree *)&local_88);
        }
        else {
          (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_finish)->total_count_ =
               (undefined4)local_88._M_original_len;
          (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_finish)->index_left_ = local_88._M_original_len._4_2_;
          (local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
           _M_impl.super__Vector_impl_data._M_finish)->index_right_or_value_ =
               local_88._M_original_len._6_2_;
          local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_a8.
               super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        lVar11 = lVar11 + (ulong)(uVar3 <= uVar12);
        lVar9 = lVar9 + (ulong)(uVar12 < uVar3);
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pbVar7 = local_70;
    pHVar2 = local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 != (local_38 >> 2 | 1U)) break;
    SetDepth(local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start + ((local_38 >> 2) - 1),
             local_a8.super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>.
             _M_impl.super__Vector_impl_data._M_start,local_70,'\0');
    length = local_48;
    data = local_50;
    uVar12 = local_64;
    if (1 < local_48) {
      bVar4 = *local_70;
      lVar8 = local_60;
      pbVar7 = local_70;
      pbVar10 = local_58;
      do {
        bVar1 = *pbVar10;
        bVar13 = bVar4 < bVar1;
        if (bVar4 <= bVar1) {
          bVar4 = bVar1;
        }
        if (bVar13) {
          pbVar7 = pbVar10;
        }
        pbVar10 = pbVar10 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    bVar4 = *pbVar7;
    if (pHVar2 != (HuffmanTree *)0x0) {
      operator_delete(pHVar2,(long)local_a8.
                                   super__Vector_base<brotli::HuffmanTree,_std::allocator<brotli::HuffmanTree>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar2
                     );
    }
    uVar12 = uVar12 * 2;
    if ((int)(uint)bVar4 <= local_68) {
      return;
    }
  }
  __assert_fail("tree.size() == 2 * n + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/entropy_encode.cc"
                ,0x76,
                "void brotli::CreateHuffmanTree(const uint32_t *, const size_t, const int, uint8_t *)"
               );
}

Assistant:

void CreateHuffmanTree(const uint32_t *data,
                       const size_t length,
                       const int tree_limit,
                       uint8_t *depth) {
  // For block sizes below 64 kB, we never need to do a second iteration
  // of this loop. Probably all of our block sizes will be smaller than
  // that, so this loop is mostly of academic interest. If we actually
  // would need this, we would be better off with the Katajainen algorithm.
  for (uint32_t count_limit = 1; ; count_limit *= 2) {
    std::vector<HuffmanTree> tree;
    tree.reserve(2 * length + 1);

    for (size_t i = length; i != 0;) {
      --i;
      if (data[i]) {
        const uint32_t count = std::max(data[i], count_limit);
        tree.push_back(HuffmanTree(count, -1, static_cast<int16_t>(i)));
      }
    }

    const size_t n = tree.size();
    if (n == 1) {
      depth[tree[0].index_right_or_value_] = 1;      // Only one element.
      break;
    }

    std::stable_sort(tree.begin(), tree.end(), SortHuffmanTree);

    // The nodes are:
    // [0, n): the sorted leaf nodes that we start with.
    // [n]: we add a sentinel here.
    // [n + 1, 2n): new parent nodes are added here, starting from
    //              (n+1). These are naturally in ascending order.
    // [2n]: we add a sentinel at the end as well.
    // There will be (2n+1) elements at the end.
    const HuffmanTree sentinel(std::numeric_limits<uint32_t>::max(), -1, -1);
    tree.push_back(sentinel);
    tree.push_back(sentinel);

    size_t i = 0;      // Points to the next leaf node.
    size_t j = n + 1;  // Points to the next non-leaf node.
    for (size_t k = n - 1; k != 0; --k) {
      size_t left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }

      // The sentinel node becomes the parent node.
      size_t j_end = tree.size() - 1;
      tree[j_end].total_count_ =
          tree[left].total_count_ + tree[right].total_count_;
      tree[j_end].index_left_ = static_cast<int16_t>(left);
      tree[j_end].index_right_or_value_ = static_cast<int16_t>(right);

      // Add back the last sentinel node.
      tree.push_back(sentinel);
    }
    assert(tree.size() == 2 * n + 1);
    SetDepth(tree[2 * n - 1], &tree[0], depth, 0);

    // We need to pack the Huffman tree in tree_limit bits.
    // If this was not successful, add fake entities to the lowest values
    // and retry.
    if (*std::max_element(&depth[0], &depth[length]) <= tree_limit) {
      break;
    }
  }
}